

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O2

void printf_test(void)

{
  bitset_container_t *bitset;
  
  bitset = bitset_container_create();
  _assert_true((unsigned_long)bitset,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x36);
  bitset_container_set(bitset,1);
  bitset_container_set(bitset,2);
  bitset_container_set(bitset,3);
  bitset_container_set(bitset,10);
  bitset_container_set(bitset,10000);
  bitset_container_printf(bitset);
  putchar(10);
  bitset_container_free(bitset);
  return;
}

Assistant:

DEFINE_TEST(printf_test) {
    bitset_container_t* B = bitset_container_create();
    assert_non_null(B);

    bitset_container_set(B, 1U);
    bitset_container_set(B, 2U);
    bitset_container_set(B, 3U);
    bitset_container_set(B, 10U);
    bitset_container_set(B, 10000U);

    bitset_container_printf(B);  // does it crash?
    printf("\n");

    bitset_container_free(B);
}